

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O3

void xmlSaveWriteAttrContent(xmlSaveCtxt *ctxt,xmlAttrPtr attr)

{
  xmlOutputBufferPtr out;
  _xmlNode *p_Var1;
  
  p_Var1 = attr->children;
  if (p_Var1 != (_xmlNode *)0x0) {
    out = ctxt->buf;
    do {
      if (p_Var1->type == XML_ENTITY_REF_NODE) {
        xmlOutputBufferWrite(out,1,"&");
        xmlOutputBufferWriteString(out,(char *)p_Var1->name);
        xmlOutputBufferWrite(out,1,";");
      }
      else if (p_Var1->type == XML_TEXT_NODE) {
        xmlSerializeText(ctxt->buf,p_Var1->content,(uint)(ctxt->encoding == (xmlChar *)0x0) * 2 + 1)
        ;
      }
      p_Var1 = p_Var1->next;
    } while (p_Var1 != (_xmlNode *)0x0);
  }
  return;
}

Assistant:

static void
xmlSaveWriteAttrContent(xmlSaveCtxt *ctxt, xmlAttrPtr attr)
{
    xmlNodePtr children;
    xmlOutputBufferPtr buf = ctxt->buf;

    children = attr->children;
    while (children != NULL) {
        switch (children->type) {
            case XML_TEXT_NODE:
	        xmlSaveWriteText(ctxt, children->content, XML_ESCAPE_ATTR);
		break;
            case XML_ENTITY_REF_NODE:
                xmlOutputBufferWrite(buf, 1, "&");
                xmlOutputBufferWriteString(buf, (const char *) children->name);
                xmlOutputBufferWrite(buf, 1, ";");
                break;
            default:
                /* should not happen unless we have a badly built tree */
                break;
        }
        children = children->next;
    }
}